

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5StorageInsertCallback
              (void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  int iCol;
  long *plVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int nToken_00;
  long lVar7;
  
  plVar1 = *(long **)(*pContext + 8);
  iVar4 = *(int *)((long)pContext + 0xc);
  if ((tflags & 1U) == 0) {
    iVar4 = iVar4 + 1;
  }
  else {
    if (iVar4 != 0) goto LAB_001d1e00;
    iVar4 = 1;
  }
  *(int *)((long)pContext + 0xc) = iVar4;
LAB_001d1e00:
  nToken_00 = 0x8000;
  if (nToken < 0x8000) {
    nToken_00 = nToken;
  }
  iCol = *(int *)((long)pContext + 8);
  lVar2 = *plVar1;
  iVar5 = sqlite3Fts5HashWrite((Fts5Hash *)plVar1[3],plVar1[5],iCol,iVar4 + -1,'0',pToken,nToken_00)
  ;
  iVar6 = *(int *)(lVar2 + 0x30);
  if (iVar5 == 0 && 0 < iVar6) {
    lVar7 = 1;
    do {
      iVar5 = sqlite3Fts5IndexCharlenToBytelen
                        (pToken,nToken_00,*(int *)(*(long *)(lVar2 + 0x38) + -4 + lVar7 * 4));
      if (iVar5 == 0) {
        iVar5 = 0;
      }
      else {
        iVar5 = sqlite3Fts5HashWrite
                          ((Fts5Hash *)plVar1[3],plVar1[5],iCol,iVar4 + -1,(char)lVar7 + '0',pToken,
                           iVar5);
        iVar6 = *(int *)(lVar2 + 0x30);
      }
    } while ((iVar5 == 0) && (bVar3 = lVar7 < iVar6, lVar7 = lVar7 + 1, bVar3));
  }
  return iVar5;
}

Assistant:

static int fts5StorageInsertCallback(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  Fts5InsertCtx *pCtx = (Fts5InsertCtx*)pContext;
  Fts5Index *pIdx = pCtx->pStorage->pIndex;
  UNUSED_PARAM2(iUnused1, iUnused2);
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;
  if( (tflags & FTS5_TOKEN_COLOCATED)==0 || pCtx->szCol==0 ){
    pCtx->szCol++;
  }
  return sqlite3Fts5IndexWrite(pIdx, pCtx->iCol, pCtx->szCol-1, pToken, nToken);
}